

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::FIDoubleValueImpl::~FIDoubleValueImpl(FIDoubleValueImpl *this)

{
  pointer pcVar1;
  pointer pdVar2;
  
  (this->super_FIDoubleValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__009d0d70;
  pcVar1 = (this->strValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->strValue).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_FIDoubleValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_009d0db0;
  pdVar2 = (this->super_FIDoubleValue).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

inline FIDoubleValueImpl(std::vector<double> &&value_): strValueValid(false) { value = std::move(value_); }